

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O2

Result __thiscall tonk::SecureRandom_Next(tonk *this,uint8_t *key,uint bytes)

{
  int iVar1;
  undefined8 *puVar2;
  Result *success;
  allocator local_41;
  Locker locker;
  string local_38 [32];
  
  locker.TheLock = (Lock *)PrngLock;
  std::recursive_mutex::lock((recursive_mutex *)PrngLock);
  iVar1 = cymric_random((cymric_rng *)Prng,key,bytes);
  if (iVar1 == 0) {
    *(undefined8 *)this = 0;
  }
  else {
    std::__cxx11::string::string(local_38,"cymric_random failed",&local_41);
    puVar2 = (undefined8 *)operator_new(0x38);
    *puVar2 = "SecureRandom_Next";
    std::__cxx11::string::string((string *)(puVar2 + 1),local_38);
    *(undefined4 *)(puVar2 + 5) = 3;
    *(undefined8 **)this = puVar2;
    puVar2[6] = (long)iVar1;
    std::__cxx11::string::~string(local_38);
  }
  Locker::~Locker(&locker);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SecureRandom_Next(uint8_t* key, unsigned bytes)
{
    Locker locker(PrngLock);
    TONK_DEBUG_ASSERT(PrngInitialized);

    int cymricResult = cymric_random(&Prng, key, static_cast<int>(bytes));
    if (0 != cymricResult)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return Result("SecureRandom_Next", "cymric_random failed", ErrorType::Cymric, cymricResult);
    }

    return Result::Success();
}